

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::initTest
          (TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this)

{
  byte bVar1;
  _tessellation_primitive_mode primitive_mode;
  _tessellation_primitive_mode n_patch_vertices_00;
  GLint n_instances_00;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  NotSupportedError *this_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TessellationShaderUtils *this_01;
  undefined1 local_108 [8];
  _run run;
  uint drawcall_count_multiplier;
  uint n_drawcall_count_multiplier;
  GLint current_n_instances;
  uint n_instances_item;
  bool current_is_indiced_draw_call;
  uint n_is_indiced_draw_call_flag;
  GLint current_n_patch_vertices;
  uint n_patch_vertices_item;
  _tessellation_primitive_mode current_primitive_mode;
  uint n_primitive_mode;
  uint n_primitive_modes;
  uint n_n_patch_vertices;
  uint n_n_instances;
  uint n_is_indiced_draw_call_flags;
  uint n_drawcall_count_multipliers;
  _tessellation_primitive_mode primitive_modes [3];
  GLint n_patch_vertices [3];
  GLint n_instances [2];
  bool is_indiced_draw_call_flags [2];
  uint drawcall_count_multipliers [2];
  GLint gl_max_patch_vertices_value;
  uint n_shaders;
  GLuint shaders [2];
  char *vs_body;
  char *fs_body;
  Functions *gl;
  allocator<char> local_31;
  string local_30;
  TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *local_10;
  TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this_local;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    gl._3_1_ = 1;
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Tessellation shader functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    gl._3_1_ = 0;
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  fs_body = (char *)CONCAT44(extraout_var,iVar2);
  this_01 = (TessellationShaderUtils *)operator_new(0x20);
  TessellationShaderUtils::TessellationShaderUtils
            (this_01,(Functions *)fs_body,&this->super_TestCaseBase);
  this->m_utils_ptr = this_01;
  (**(code **)(fs_body + 0x708))(1,&this->m_vao_id);
  dVar3 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar3,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x3f4);
  (**(code **)(fs_body + 0xd8))(this->m_vao_id);
  dVar3 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar3,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x3f7);
  (**(code **)(fs_body + 0x6c8))(1,&this->m_bo_id);
  dVar3 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar3,"glGenBuffers() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x3fb);
  GVar4 = (**(code **)(fs_body + 0x3f0))(0x8b30);
  this->m_fs_id = GVar4;
  GVar4 = (**(code **)(fs_body + 0x3f0))(0x8b31);
  this->m_vs_id = GVar4;
  dVar3 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar3,"glCreateShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x3ff);
  vs_body = "${VERSION}\n\nvoid main()\n{\n}\n";
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_fs_id,1,&vs_body);
  dVar3 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar3,"glShaderSource() failed for fragment shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x409);
  shaders = (GLuint  [2])anon_var_dwarf_82625e;
  TestCaseBase::shaderSourceSpecialized
            (&this->super_TestCaseBase,this->m_vs_id,1,(GLchar **)shaders);
  dVar3 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar3,"glShaderSource() failed for vertex shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x416);
  gl_max_patch_vertices_value = this->m_fs_id;
  n_shaders = this->m_vs_id;
  drawcall_count_multipliers[1] = 2;
  TessellationShaderUtils::compileShaders
            (this->m_utils_ptr,2,(GLuint *)&gl_max_patch_vertices_value,true);
  drawcall_count_multipliers[0] = 0;
  (**(code **)(fs_body + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_PATCH_VERTICES,drawcall_count_multipliers)
  ;
  dVar3 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_PATCH_VERTICES_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x422);
  stack0xffffffffffffff88 = 0x600000003;
  n_instances[0]._2_2_ = 0x100;
  n_patch_vertices[1] = 1;
  n_patch_vertices[2] = 4;
  primitive_modes[1] = 4;
  primitive_modes[2] = (int)drawcall_count_multipliers[0] / 2;
  n_patch_vertices[0] = drawcall_count_multipliers[0];
  _n_is_indiced_draw_call_flags = 0x200000000;
  primitive_modes[0] = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;
  for (n_patch_vertices_item = 0; n_patch_vertices_item < 3;
      n_patch_vertices_item = n_patch_vertices_item + 1) {
    primitive_mode = (&n_is_indiced_draw_call_flags)[n_patch_vertices_item];
    for (n_is_indiced_draw_call_flag = 0; n_is_indiced_draw_call_flag < 3;
        n_is_indiced_draw_call_flag = n_is_indiced_draw_call_flag + 1) {
      n_patch_vertices_00 = primitive_modes[(ulong)n_is_indiced_draw_call_flag + 1];
      for (n_instances_item = 0; n_instances_item < 2; n_instances_item = n_instances_item + 1) {
        bVar1 = *(byte *)((long)n_instances + (ulong)n_instances_item + 2);
        for (n_drawcall_count_multiplier = 0; n_drawcall_count_multiplier < 2;
            n_drawcall_count_multiplier = n_drawcall_count_multiplier + 1) {
          n_instances_00 = n_patch_vertices[(ulong)n_drawcall_count_multiplier + 1];
          for (run.te_id = 0; run.te_id < 2; run.te_id = run.te_id + 1) {
            run.tc_id = n_instances[(ulong)run.te_id + 1];
            _run::_run((_run *)local_108);
            initRun(this,(_run *)local_108,primitive_mode,n_patch_vertices_00,(bool)(bVar1 & 1),
                    n_instances_00,run.tc_id);
            std::
            vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
            ::push_back(&this->m_runs,(value_type *)local_108);
          }
        }
      }
    }
  }
  (**(code **)(fs_body + 0x40))(0x8c8e,this->m_bo_id);
  dVar3 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar3,"glBindBuffer() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x45e);
  (**(code **)(fs_body + 0x48))(0x8c8e,0,this->m_bo_id);
  dVar3 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar3,"glBindBufferBase() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x461);
  return;
}

Assistant:

void TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::initTest()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Set up Utils instance */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_utils_ptr = new TessellationShaderUtils(gl, this);

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Generate all test-wide objects needed for test execution */
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed");

	/* Configure fragment shader body */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	shaderSourceSpecialized(m_fs_id, 1 /* count */, &fs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for fragment shader");

	/* Configure vertex shader body */
	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "in vec4 vertex_data;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = vertex_data;\n"
						  "}\n";

	shaderSourceSpecialized(m_vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for vertex shader");

	/* Compile all the shaders */
	const glw::GLuint  shaders[] = { m_fs_id, m_vs_id };
	const unsigned int n_shaders = sizeof(shaders) / sizeof(shaders[0]);

	m_utils_ptr->compileShaders(n_shaders, shaders, true /* should_succeed */);

	/* Retrieve GL_MAX_PATCH_VERTICES_EXT value before we continue */
	glw::GLint gl_max_patch_vertices_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_PATCH_VERTICES, &gl_max_patch_vertices_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_PATCH_VERTICES_EXT pname");

	/* Initialize all test passes */
	const unsigned int drawcall_count_multipliers[] = { 3, 6 };
	const bool		   is_indiced_draw_call_flags[] = { false, true };
	const glw::GLint   n_instances[]				= { 1, 4 };
	const glw::GLint   n_patch_vertices[] = { 4, gl_max_patch_vertices_value / 2, gl_max_patch_vertices_value };
	const _tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES };
	const unsigned int n_drawcall_count_multipliers =
		sizeof(drawcall_count_multipliers) / sizeof(drawcall_count_multipliers[0]);
	const unsigned int n_is_indiced_draw_call_flags =
		sizeof(is_indiced_draw_call_flags) / sizeof(is_indiced_draw_call_flags[0]);
	const unsigned int n_n_instances	  = sizeof(n_instances) / sizeof(n_instances[0]);
	const unsigned int n_n_patch_vertices = sizeof(n_patch_vertices) / sizeof(n_patch_vertices[0]);
	const unsigned int n_primitive_modes  = sizeof(primitive_modes) / sizeof(primitive_modes[0]);

	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_primitive_mode current_primitive_mode = primitive_modes[n_primitive_mode];

		for (unsigned int n_patch_vertices_item = 0; n_patch_vertices_item < n_n_patch_vertices;
			 ++n_patch_vertices_item)
		{
			glw::GLint current_n_patch_vertices = n_patch_vertices[n_patch_vertices_item];

			for (unsigned int n_is_indiced_draw_call_flag = 0;
				 n_is_indiced_draw_call_flag < n_is_indiced_draw_call_flags; ++n_is_indiced_draw_call_flag)
			{
				bool current_is_indiced_draw_call = is_indiced_draw_call_flags[n_is_indiced_draw_call_flag];

				for (unsigned int n_instances_item = 0; n_instances_item < n_n_instances; ++n_instances_item)
				{
					glw::GLint current_n_instances = n_instances[n_instances_item];

					for (unsigned int n_drawcall_count_multiplier = 0;
						 n_drawcall_count_multiplier < n_drawcall_count_multipliers; ++n_drawcall_count_multiplier)
					{
						const unsigned int drawcall_count_multiplier =
							drawcall_count_multipliers[n_drawcall_count_multiplier];

						/* Form the run descriptor */
						_run run;

						initRun(run, current_primitive_mode, current_n_patch_vertices, current_is_indiced_draw_call,
								current_n_instances, drawcall_count_multiplier);

						/* Store the descriptor for later execution */
						m_runs.push_back(run);
					}
				} /* for (all 'number of instances' settings) */
			}	 /* for (all 'is indiced draw call' flags) */
		}		  /* for (all 'n patch vertices' settings) */
	}			  /* for (all primitive modes) */

	/* Set up buffer object bindings. Storage size will be determined on
	 * a per-iteration basis.
	 **/
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed");
}